

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm2dot_playground.cpp
# Opt level: O2

ostream * operator<<(ostream *os,fsm_def *sm)

{
  pointer pbVar1;
  pointer ptVar2;
  ostream *poVar3;
  transition *transition;
  pointer t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *state;
  pointer pbVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  poVar3 = std::operator<<(os,"digraph ");
  poVar3 = std::operator<<(poVar3,(string *)&sm->name);
  std::operator<<(poVar3," {\n");
  fsm_def::get_states_abi_cxx11_(&local_48,sm);
  for (pbVar4 = local_48.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar4 != local_48.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
    poVar3 = std::operator<<(os,"\t");
    poVar3 = std::operator<<(poVar3,(string *)pbVar4);
    std::operator<<(poVar3,";\n");
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  std::operator<<(os,"\n");
  pbVar1 = (sm->general_options).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = (sm->general_options).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    poVar3 = std::operator<<(os,"\t");
    poVar3 = std::operator<<(poVar3,(string *)pbVar4);
    std::operator<<(poVar3,";\n");
  }
  std::operator<<(os,"\n");
  ptVar2 = (sm->transitions).super__Vector_base<transition,_std::allocator<transition>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (t = (sm->transitions).super__Vector_base<transition,_std::allocator<transition>_>._M_impl.
           super__Vector_impl_data._M_start; t != ptVar2; t = t + 1) {
    poVar3 = std::operator<<(os,"\t");
    poVar3 = operator<<(poVar3,t);
    std::operator<<(poVar3,"\n");
  }
  std::operator<<(os,"}\n");
  return os;
}

Assistant:

inline std::ostream& operator <<(std::ostream& os,	fsm_def& sm)
{
    os << "digraph " << sm.name << " {\n";
    for (const auto& state : sm.get_states()) {
        os << "\t" << state << ";\n";
    }
    os << "\n";
    for (const auto& option : sm.general_options) {
        os << "\t" << option << ";\n";
    }
    os << "\n";

    for (const auto& transition : sm.transitions) {
        os << "\t" << transition << "\n";
    }
    os << "}\n";
    return os;
}